

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O3

void pop_container(mu_Context *ctx)

{
  mu_Vec2 mVar1;
  undefined8 uVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  mu_Container *pmVar6;
  _func_void_mu_Context_ptr_mu_Rect_int *p_Var7;
  code *pcVar8;
  int iVar9;
  long extraout_RDX;
  int in_ESI;
  mu_Context *pmVar10;
  mu_Vec2 mVar11;
  
  pmVar10 = ctx;
  pmVar6 = mu_get_current_container(ctx);
  iVar9 = (ctx->layout_stack).idx;
  p_Var7 = (_func_void_mu_Context_ptr_mu_Rect_int *)(long)iVar9;
  mVar1 = (ctx->layout_stack).items[(long)(p_Var7 + -1)].max;
  uVar2 = *(undefined8 *)((long)&ctx->id_stack + (long)p_Var7 * 0x8c + -4);
  mVar11.x = mVar1.x - (int)uVar2;
  mVar11.y = mVar1.y - (int)((ulong)uVar2 >> 0x20);
  pmVar6->content_size = mVar11;
  iVar3 = (ctx->container_stack).idx;
  if (iVar3 < 1) {
    pop_container_cold_1();
  }
  else {
    (ctx->container_stack).idx = iVar3 + -1;
    if (0 < iVar9) {
      (ctx->layout_stack).idx = iVar9 + -1;
      mu_pop_id(ctx);
      return;
    }
  }
  pop_container_cold_2();
  iVar9 = 0;
  if (1 < in_ESI) {
    iVar9 = in_ESI + -1;
  }
  *(int *)&pmVar10->text_width = iVar9;
  pmVar10->text_height = (_func_int_mu_Font *)(extraout_RDX + (ulong)(1 < in_ESI) * 8);
  pmVar10->draw_frame = p_Var7;
  (pmVar10->_style).font = (mu_Font)0x0;
  (pmVar10->_style).size.x = 0;
  (pmVar10->_style).size.y = 0;
  pcVar8 = p_Var7 + 8;
  iVar9 = 1;
  while( true ) {
    pcVar5 = *(char **)(pcVar8 + -8);
    if ((pcVar5 == (char *)0x0) && (*(int *)pcVar8 == 0)) {
      return;
    }
    uVar4 = *(uint *)(pcVar8 + 0x10);
    if (((((ulong)uVar4 < 0x40) && ((0x8000080200000000U >> ((ulong)uVar4 & 0x3f) & 1) != 0)) ||
        (uVar4 == 0xffffffff)) || ((pcVar5 != (char *)0x0 && (*pcVar5 == '-')))) break;
    *(int *)&(pmVar10->_style).font = iVar9;
    iVar9 = iVar9 + 1;
    pcVar8 = pcVar8 + 0x30;
  }
  return;
}

Assistant:

static void pop_container(mu_Context *ctx) {
  mu_Container *cnt = mu_get_current_container(ctx);
  mu_Layout *layout = get_layout(ctx);
  cnt->content_size.x = layout->max.x - layout->body.x;
  cnt->content_size.y = layout->max.y - layout->body.y;
  /* pop container, layout and id */
  pop(ctx->container_stack);
  pop(ctx->layout_stack);
  mu_pop_id(ctx);
}